

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O2

int CountQCost(void)

{
  int iVar1;
  Cube *p;
  int iVar2;
  
  p = IterCubeSetStart();
  iVar2 = 0;
  while (p != (Cube *)0x0) {
    iVar1 = ComputeQCostBits(p);
    iVar2 = iVar2 + iVar1;
    p = IterCubeSetNext();
  }
  return iVar2;
}

Assistant:

int CountQCost()
{
    Cube* p;
    int QCost = 0;
    int QCostControl = 0;
    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        QCostControl += p->q;
        QCost += ComputeQCostBits( p );
    }
//    if ( QCostControl != QCost )
//        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", QCostControl, QCost );
    return QCost;
}